

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

uintmax_t ghc::filesystem::file_size(path *p,error_code *ec)

{
  int iVar1;
  error_category *peVar2;
  int *piVar3;
  stat fileStat;
  stat sStack_a8;
  
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  iVar1 = stat((p->_path)._M_dataplus._M_p,&sStack_a8);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    ec->_M_value = *piVar3;
    ec->_M_cat = peVar2;
    sStack_a8.st_size = 0xffffffffffffffff;
  }
  return sStack_a8.st_size;
}

Assistant:

GHC_INLINE uintmax_t file_size(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!GetFileAttributesExW(detail::fromUtf8<std::wstring>(p.u8string()).c_str(), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
        return static_cast<uintmax_t>(-1);
    }
    return static_cast<uintmax_t>(attr.nFileSizeHigh) << (sizeof(attr.nFileSizeHigh) * 8) | attr.nFileSizeLow;
#else
    struct ::stat fileStat;
    if (::stat(p.c_str(), &fileStat) == -1) {
        ec = detail::make_system_error();
        return static_cast<uintmax_t>(-1);
    }
    return static_cast<uintmax_t>(fileStat.st_size);
#endif
}